

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O2

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantGep
          (LLVMPointerGraphBuilder *this,GetElementPtrInst *GEP)

{
  Value *val;
  char cVar1;
  uint numBits;
  uint uVar2;
  PSNode *pPVar3;
  DataLayout *DL;
  APInt *pAVar4;
  raw_ostream *prVar5;
  anon_union_8_2_1313ab2f_for_U aVar7;
  Pointer PVar8;
  APInt offset;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  Offset OVar6;
  
  val = *(Value **)(GEP + -(ulong)(uint)(*(int *)(GEP + 0x14) << 5));
  pPVar3 = getOperand(this,val);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin((const_iterator *)&local_48,&(pPVar3->pointsTo).pointers);
  PVar8 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_48);
  OVar6 = PVar8.offset.offset;
  DL = (DataLayout *)llvm::Module::getDataLayout();
  numBits = llvmutils::getPointerBitwidth(DL,val);
  llvm::APInt::APInt((APInt *)&local_48,numBits,0,false);
  pAVar4 = (APInt *)llvm::Module::getDataLayout();
  cVar1 = llvm::GetElementPtrInst::accumulateConstantOffset((DataLayout *)GEP,pAVar4);
  if (cVar1 != '\0') {
    uVar2 = llvm::APInt::getActiveBits((APInt *)&local_48);
    if ((numBits < uVar2) || (OVar6.offset == Offset::UNKNOWN)) {
      prVar5 = (raw_ostream *)llvm::errs();
      prVar5 = llvm::raw_ostream::operator<<(prVar5,"WARN: Offset greater than ");
      prVar5 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar5,(ulong)numBits);
      prVar5 = llvm::raw_ostream::operator<<(prVar5,"-bit");
      prVar5 = llvm::operator<<(prVar5,(Value *)GEP);
      llvm::raw_ostream::operator<<(prVar5,"\n");
    }
    else {
      aVar7.pVal = (uint64_t *)&local_48;
      if (0x40 < local_40) {
        aVar7 = local_48;
      }
      OVar6.offset = *aVar7.pVal;
    }
  }
  llvm::APInt::~APInt((APInt *)&local_48);
  PVar8.offset.offset = OVar6.offset;
  return PVar8;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantGep(const llvm::GetElementPtrInst *GEP) {
    using namespace llvm;

    const Value *op = GEP->getPointerOperand();
    Pointer pointer(UNKNOWN_MEMORY, Offset::UNKNOWN);

    // get operand PSNode (this may result in recursive call,
    // if this gep is recursively defined)
    PSNode *opNode = getOperand(op);
    assert(opNode->pointsTo.size() == 1 &&
           "Constant node has more that 1 pointer");
    pointer = *(opNode->pointsTo.begin());

    unsigned bitwidth = llvmutils::getPointerBitwidth(&M->getDataLayout(), op);
    APInt offset(bitwidth, 0);

    // get offset of this GEP
    if (GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        if (offset.isIntN(bitwidth) && !pointer.offset.isUnknown())
            pointer.offset = offset.getZExtValue();
        else
            errs() << "WARN: Offset greater than " << bitwidth << "-bit" << *GEP
                   << "\n";
    }

    return pointer;
}